

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O1

void __thiscall
Kernel::Clause::collectVars2<Kernel::UnstableVarIt>
          (Clause *this,DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *acc)

{
  TermList TVar1;
  bool bVar2;
  Literal **ppLVar3;
  uint uVar4;
  uint uVar5;
  UnstableVarIt vit;
  UnstableVarIt UStack_88;
  
  uVar4 = *(uint *)&this->field_0x38 & 0xfffff;
  if (uVar4 != 0) {
    ppLVar3 = this->_literals;
    uVar5 = (uint)(uVar4 != 0);
    do {
      UnstableVarIt::UnstableVarIt(&UStack_88,&(*ppLVar3)->super_Term);
      while (bVar2 = UnstableVarIt::hasNext(&UStack_88), TVar1._content = UStack_88._next._content,
            bVar2) {
        UStack_88._next._content = 2;
        ::Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                  (&acc->_map,TVar1._content >> 2);
      }
      UnstableVarIt::~UnstableVarIt(&UStack_88);
      ppLVar3 = this->_literals + (int)uVar5;
      bVar2 = uVar5 < uVar4;
      uVar5 = (uVar5 < uVar4) + uVar5;
    } while (bVar2);
  }
  return;
}

Assistant:

void Clause::collectVars2(DHSet<unsigned>& acc)
{
  for (Literal* lit : iterLits()) {
    VarIt vit(lit);
    while (vit.hasNext()) {
      TermList var = vit.next();
      ASS(var.isOrdinaryVar());
      acc.insert(var.var());
    }
  }
}